

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateUTest.hpp
# Opt level: O0

void Qentem::Test::TestVariableUTag3(QTest *test)

{
  uint uVar1;
  StringStream<char16_t> *pSVar2;
  Value<char16_t> local_70;
  Value<char16_t> local_58;
  char16_t *local_40;
  char16_t *content;
  Value<char16_t> value;
  StringStream<char16_t> ss;
  QTest *test_local;
  
  StringStream<char16_t>::StringStream((StringStream<char16_t> *)&value.type_);
  Value<char16_t>::Value((Value<char16_t> *)&content);
  local_40 = L"{var:0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:0}",(Value<char16_t> *)&content,(StringStream<char16_t> *)&value.type_)
  ;
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])0x130248,0x159);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:a}",(Value<char16_t> *)&content,(StringStream<char16_t> *)&value.type_)
  ;
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])L"{var:a}",0x15c);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{var:0[0]}";
  uVar1 = StringUtils::Count<char16_t,unsigned_int>(L"{var:0[0]}");
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:0[0]}",uVar1,(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[11]>
            (test,pSVar2,(char16_t (*) [11])L"{var:0[0]}",0x160);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{var:a[0]}";
  uVar1 = StringUtils::Count<char16_t,unsigned_int>(L"{var:a[0]}");
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:a[0]}",uVar1,(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[11]>
            (test,pSVar2,(char16_t (*) [11])L"{var:a[0]}",0x164);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{var:0[a]}";
  uVar1 = StringUtils::Count<char16_t,unsigned_int>(L"{var:0[a]}");
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:0[a]}",uVar1,(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[11]>
            (test,pSVar2,(char16_t (*) [11])L"{var:0[a]}",0x168);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{var:a[abc]}";
  uVar1 = StringUtils::Count<char16_t,unsigned_int>(L"{var:a[abc]}");
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:a[abc]}",uVar1,(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[13]>
            (test,pSVar2,(char16_t (*) [13])L"{var:a[abc]}",0x16c);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  JSON::Parse<char16_t>(&local_58,L"[[[]],{\"a\":[\"x\"],\"b\":{\"a\":\"X\"}}]");
  Value<char16_t>::operator=((Value<char16_t> *)&content,&local_58);
  Value<char16_t>::~Value(&local_58);
  local_40 = L"{var:0}";
  uVar1 = StringUtils::Count<char16_t,unsigned_int>(L"{var:0}");
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:0}",uVar1,(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])0x130248,0x174);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{var:0[0]}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:0[0]}",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[11]>
            (test,pSVar2,(char16_t (*) [11])L"{var:0[0]}",0x178);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{var:0[0][0]}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:0[0][0]}",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[14]>
            (test,pSVar2,(char16_t (*) [14])L"{var:0[0][0]}",0x17c);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{var:1}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:1}",(Value<char16_t> *)&content,(StringStream<char16_t> *)&value.type_)
  ;
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])L"{var:1}",0x182);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{var:2}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:2}",(Value<char16_t> *)&content,(StringStream<char16_t> *)&value.type_)
  ;
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])0x12fd4a,0x186);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{var:1[a]}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:1[a]}",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[11]>
            (test,pSVar2,(char16_t (*) [11])L"{var:1[a]}",0x18a);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{var:1[b]}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:1[b]}",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[11]>
            (test,pSVar2,(char16_t (*) [11])L"{var:1[b]}",0x18e);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  JSON::Parse<char16_t>(&local_70,L"[\"A\", \"abc\", true, 456, 1.5]");
  Value<char16_t>::operator=((Value<char16_t> *)&content,&local_70);
  Value<char16_t>::~Value(&local_70);
  local_40 = L"{var:0";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:0",(Value<char16_t> *)&content,(StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,pSVar2,(char16_t (*) [7])0x1308d4,0x196);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"var:0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"var:0}",(Value<char16_t> *)&content,(StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,pSVar2,(char16_t (*) [7])0x13024a,0x19a);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{v}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{v}",(Value<char16_t> *)&content,(StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar2,(char16_t (*) [4])L"{v}",0x19e);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{va}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{va}",(Value<char16_t> *)&content,(StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (test,pSVar2,(char16_t (*) [5])L"{va}",0x1a2);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{var}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var}",(Value<char16_t> *)&content,(StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar2,(char16_t (*) [6])L"{var}",0x1a6);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{var:}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:}",(Value<char16_t> *)&content,(StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,pSVar2,(char16_t (*) [7])L"{var:}",0x1aa);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{v:0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{v:0}",(Value<char16_t> *)&content,(StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar2,(char16_t (*) [6])L"{v:0}",0x1ae);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{va:0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{va:0}",(Value<char16_t> *)&content,(StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,pSVar2,(char16_t (*) [7])L"{va:0}",0x1b2);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{var:0{var:0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:0{var:0}",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])L"{var:0A",0x1b8);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"var:0{var:0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"var:0{var:0}",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,pSVar2,(char16_t (*) [7])0x130536,0x1bc);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"var:0}{var:0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"var:0}{var:0}",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])L"var:0}A",0x1c0);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{var:0{var:0}{var:0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:0{var:0}{var:0}",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (test,pSVar2,(char16_t (*) [9])L"{var:0AA",0x1c4);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{var:1{var:0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:1{var:0}",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])L"{var:1A",0x1ca);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"var:1{var:0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"var:1{var:0}",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,pSVar2,(char16_t (*) [7])0x1305ae,0x1ce);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"var:1}{var:0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"var:1}{var:0}",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])L"var:1}A",0x1d2);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{var:1{var:0}{var:0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:1{var:0}{var:0}",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (test,pSVar2,(char16_t (*) [9])L"{var:1AA",0x1d6);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{{var:0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{{var:0}",(Value<char16_t> *)&content,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"{A",0x1dc);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{{var:0}{var:0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{{var:0}{var:0}",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar2,(char16_t (*) [4])L"{AA",0x1e0);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{v{var:0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{v{var:0}",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar2,(char16_t (*) [4])L"{vA",0x1e4);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{v{var:0}{var:0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{v{var:0}{var:0}",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (test,pSVar2,(char16_t (*) [5])L"{vAA",0x1e8);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{va{var:0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{va{var:0}",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (test,pSVar2,(char16_t (*) [5])L"{vaA",0x1ec);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{va{var:0}{var:0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{va{var:0}{var:0}",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar2,(char16_t (*) [6])L"{vaAA",0x1f0);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{var{var:0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var{var:0}",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar2,(char16_t (*) [6])L"{varA",500);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{var{var:0}{var:0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var{var:0}{var:0}",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,pSVar2,(char16_t (*) [7])L"{varAA",0x1f8);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{-{var:0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{-{var:0}",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar2,(char16_t (*) [4])L"{-A",0x1fe);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{-{var:0}{var:0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{-{var:0}{var:0}",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (test,pSVar2,(char16_t (*) [5])L"{-AA",0x202);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{v-{var:0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{v-{var:0}",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (test,pSVar2,(char16_t (*) [5])L"{v-A",0x206);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{v-{var:0}{var:0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{v-{var:0}{var:0}",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar2,(char16_t (*) [6])L"{v-AA",0x20a);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{va-{var:0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{va-{var:0}",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar2,(char16_t (*) [6])L"{va-A",0x20e);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{va-{var:0}{var:0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{va-{var:0}{var:0}",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,pSVar2,(char16_t (*) [7])L"{va-AA",0x212);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{var-{var:0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var-{var:0}",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,pSVar2,(char16_t (*) [7])L"{var-A",0x216);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{var-{var:0}{var:0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var-{var:0}{var:0}",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])L"{var-AA",0x21a);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{var-0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var-0}",(Value<char16_t> *)&content,(StringStream<char16_t> *)&value.type_)
  ;
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])0x13088a,0x220);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{var 0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var 0}",(Value<char16_t> *)&content,(StringStream<char16_t> *)&value.type_)
  ;
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])0x13089c,0x224);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{var:0 }";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:0 }",(Value<char16_t> *)&content,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (test,pSVar2,(char16_t (*) [9])0x1308ae,0x228);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{var:0 ";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:0 ",(Value<char16_t> *)&content,(StringStream<char16_t> *)&value.type_)
  ;
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])0x1308c2,0x22c);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L"{var:0";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:0",(Value<char16_t> *)&content,(StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,pSVar2,(char16_t (*) [7])0x1308d4,0x230);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L" {var-0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L" {var-0}",(Value<char16_t> *)&content,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (test,pSVar2,(char16_t (*) [9])L" {var-0}",0x234);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L" {var 0}";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L" {var 0}",(Value<char16_t> *)&content,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (test,pSVar2,(char16_t (*) [9])L" {var 0}",0x238);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L" {var:0 }";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L" {var:0 }",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[10]>
            (test,pSVar2,(char16_t (*) [10])L" {var:0 }",0x23c);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L" {var:0 ";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L" {var:0 ",(Value<char16_t> *)&content,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (test,pSVar2,(char16_t (*) [9])L" {var:0 ",0x240);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  local_40 = L" {var:0";
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L" {var:0",(Value<char16_t> *)&content,(StringStream<char16_t> *)&value.type_)
  ;
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])L" {var:0",0x244);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  Value<char16_t>::~Value((Value<char16_t> *)&content);
  StringStream<char16_t>::~StringStream((StringStream<char16_t> *)&value.type_);
  return;
}

Assistant:

static void TestVariableUTag3(QTest &test) {
    StringStream<char16_t> ss;
    Value<char16_t>        value;
    const char16_t        *content;

    content = uR"({var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0})", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({var:a})", value, ss), uR"({var:a})", __LINE__);
    ss.Clear();

    content = uR"({var:0[0]})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), uR"({var:0[0]})", __LINE__);
    ss.Clear();

    content = uR"({var:a[0]})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), uR"({var:a[0]})", __LINE__);
    ss.Clear();

    content = uR"({var:0[a]})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), uR"({var:0[a]})", __LINE__);
    ss.Clear();

    content = uR"({var:a[abc]})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), uR"({var:a[abc]})", __LINE__);
    ss.Clear();

    ////////////////

    value = JSON::Parse(uR"([[[]],{"a":["x"],"b":{"a":"X"}}])");

    content = uR"({var:0})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), uR"({var:0})", __LINE__);
    ss.Clear();

    content = uR"({var:0[0]})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0[0]})", __LINE__);
    ss.Clear();

    content = uR"({var:0[0][0]})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0[0][0]})", __LINE__);
    ss.Clear();

    /////

    content = uR"({var:1})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:1})", __LINE__);
    ss.Clear();

    content = uR"({var:2})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:2})", __LINE__);
    ss.Clear();

    content = uR"({var:1[a]})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:1[a]})", __LINE__);
    ss.Clear();

    content = uR"({var:1[b]})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:1[b]})", __LINE__);
    ss.Clear();

    ////

    value = JSON::Parse(uR"(["A", "abc", true, 456, 1.5])");

    content = uR"({var:0)";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0)", __LINE__);
    ss.Clear();

    content = uR"(var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"(var:0})", __LINE__);
    ss.Clear();

    content = uR"({v})";
    test.IsEqual(Template::Render(content, value, ss), uR"({v})", __LINE__);
    ss.Clear();

    content = uR"({va})";
    test.IsEqual(Template::Render(content, value, ss), uR"({va})", __LINE__);
    ss.Clear();

    content = uR"({var})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var})", __LINE__);
    ss.Clear();

    content = uR"({var:})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:})", __LINE__);
    ss.Clear();

    content = uR"({v:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({v:0})", __LINE__);
    ss.Clear();

    content = uR"({va:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({va:0})", __LINE__);
    ss.Clear();

    ////

    content = uR"({var:0{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0A)", __LINE__);
    ss.Clear();

    content = uR"(var:0{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"(var:0A)", __LINE__);
    ss.Clear();

    content = uR"(var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"(var:0}A)", __LINE__);
    ss.Clear();

    content = uR"({var:0{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0AA)", __LINE__);
    ss.Clear();

    ////

    content = uR"({var:1{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:1A)", __LINE__);
    ss.Clear();

    content = uR"(var:1{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"(var:1A)", __LINE__);
    ss.Clear();

    content = uR"(var:1}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"(var:1}A)", __LINE__);
    ss.Clear();

    content = uR"({var:1{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:1AA)", __LINE__);
    ss.Clear();

    ////

    content = uR"({{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({A)", __LINE__);
    ss.Clear();

    content = uR"({{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({AA)", __LINE__);
    ss.Clear();

    content = uR"({v{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({vA)", __LINE__);
    ss.Clear();

    content = uR"({v{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({vAA)", __LINE__);
    ss.Clear();

    content = uR"({va{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({vaA)", __LINE__);
    ss.Clear();

    content = uR"({va{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({vaAA)", __LINE__);
    ss.Clear();

    content = uR"({var{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({varA)", __LINE__);
    ss.Clear();

    content = uR"({var{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({varAA)", __LINE__);
    ss.Clear();

    ///

    content = uR"({-{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({-A)", __LINE__);
    ss.Clear();

    content = uR"({-{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({-AA)", __LINE__);
    ss.Clear();

    content = uR"({v-{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({v-A)", __LINE__);
    ss.Clear();

    content = uR"({v-{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({v-AA)", __LINE__);
    ss.Clear();

    content = uR"({va-{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({va-A)", __LINE__);
    ss.Clear();

    content = uR"({va-{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({va-AA)", __LINE__);
    ss.Clear();

    content = uR"({var-{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var-A)", __LINE__);
    ss.Clear();

    content = uR"({var-{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var-AA)", __LINE__);
    ss.Clear();

    //

    content = uR"({var-0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var-0})", __LINE__);
    ss.Clear();

    content = uR"({var 0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var 0})", __LINE__);
    ss.Clear();

    content = uR"({var:0 })";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0 })", __LINE__);
    ss.Clear();

    content = uR"({var:0 )";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0 )", __LINE__);
    ss.Clear();

    content = uR"({var:0)";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0)", __LINE__);
    ss.Clear();

    content = uR"( {var-0})";
    test.IsEqual(Template::Render(content, value, ss), uR"( {var-0})", __LINE__);
    ss.Clear();

    content = uR"( {var 0})";
    test.IsEqual(Template::Render(content, value, ss), uR"( {var 0})", __LINE__);
    ss.Clear();

    content = uR"( {var:0 })";
    test.IsEqual(Template::Render(content, value, ss), uR"( {var:0 })", __LINE__);
    ss.Clear();

    content = uR"( {var:0 )";
    test.IsEqual(Template::Render(content, value, ss), uR"( {var:0 )", __LINE__);
    ss.Clear();

    content = uR"( {var:0)";
    test.IsEqual(Template::Render(content, value, ss), uR"( {var:0)", __LINE__);
    ss.Clear();
}